

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ThreadPool.h
# Opt level: O0

void __thiscall ThreadTask::~ThreadTask(ThreadTask *this)

{
  ThreadTask *this_local;
  
  std::condition_variable::notify_all();
  std::thread::join();
  std::condition_variable::~condition_variable(&this->_condition);
  std::queue<Task,_std::deque<Task,_std::allocator<Task>_>_>::~queue(&this->_taskQueue);
  std::thread::~thread(&this->_thread);
  return;
}

Assistant:

~ThreadTask()
	{
		this->_condition.notify_all();
		this->_thread.join();
	}